

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t is_hardlink(char *file,wchar_t line,char *path1,char *path2)

{
  int iVar1;
  char *in_RCX;
  char *in_RDX;
  wchar_t in_ESI;
  char *in_RDI;
  wchar_t r;
  stat st2;
  stat st1;
  bool local_14d;
  stat local_148;
  __dev_t local_b8;
  __ino_t local_b0;
  wchar_t local_4;
  
  assertion_count(in_RDI,in_ESI);
  iVar1 = lstat(in_RDX,(stat *)&local_b8);
  if (iVar1 == 0) {
    iVar1 = lstat(in_RCX,&local_148);
    if (iVar1 == 0) {
      local_14d = local_b0 == local_148.st_ino && local_b8 == local_148.st_dev;
      local_4 = (wchar_t)local_14d;
    }
    else {
      failure_start(in_RDI,(wchar_t)(ulong)(uint)in_ESI,"File should exist: %s",in_RCX);
      failure_finish((void *)0x106db3);
      local_4 = L'\0';
    }
  }
  else {
    failure_start(in_RDI,(wchar_t)(ulong)(uint)in_ESI,"File should exist: %s",in_RDX);
    failure_finish((void *)0x106d58);
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

static int
is_hardlink(const char *file, int line,
    const char *path1, const char *path2)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	BY_HANDLE_FILE_INFORMATION bhfi1, bhfi2;
	int r;

	assertion_count(file, line);
	r = my_GetFileInformationByName(path1, &bhfi1);
	if (r == 0) {
		failure_start(file, line, "File %s can't be inspected?", path1);
		failure_finish(NULL);
		return (0);
	}
	r = my_GetFileInformationByName(path2, &bhfi2);
	if (r == 0) {
		failure_start(file, line, "File %s can't be inspected?", path2);
		failure_finish(NULL);
		return (0);
	}
	return (bhfi1.dwVolumeSerialNumber == bhfi2.dwVolumeSerialNumber
		&& bhfi1.nFileIndexHigh == bhfi2.nFileIndexHigh
		&& bhfi1.nFileIndexLow == bhfi2.nFileIndexLow);
#else
	struct stat st1, st2;
	int r;

	assertion_count(file, line);
	r = lstat(path1, &st1);
	if (r != 0) {
		failure_start(file, line, "File should exist: %s", path1);
		failure_finish(NULL);
		return (0);
	}
	r = lstat(path2, &st2);
	if (r != 0) {
		failure_start(file, line, "File should exist: %s", path2);
		failure_finish(NULL);
		return (0);
	}
	return (st1.st_ino == st2.st_ino && st1.st_dev == st2.st_dev);
#endif
}